

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::SecretManager::RegisterSecret
          (SecretManager *this,CatalogTransaction transaction,
          unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
          *secret,OnCreateConflict on_conflict,SecretPersistType persist_type,string *storage)

{
  long *plVar1;
  undefined7 in_register_00000011;
  
  InitializeSecrets((SecretManager *)secret,transaction);
  plVar1 = *(long **)CONCAT71(in_register_00000011,on_conflict);
  *(long *)CONCAT71(in_register_00000011,on_conflict) = 0;
  RegisterSecretInternal
            (this,transaction,secret,200,persist_type,(string *)((ulong)storage & 0xffffffff));
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
}

Assistant:

unique_ptr<SecretEntry> SecretManager::RegisterSecret(CatalogTransaction transaction,
                                                      unique_ptr<const BaseSecret> secret, OnCreateConflict on_conflict,
                                                      SecretPersistType persist_type, const string &storage) {
	InitializeSecrets(transaction);
	return RegisterSecretInternal(transaction, std::move(secret), on_conflict, persist_type, storage);
}